

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O0

Float pbrt::Turbulence(Point3f *p,Vector3f *dpdx,Vector3f *dpdy,Float omega,int maxOctaves)

{
  float fVar1;
  undefined8 uVar2;
  float *pfVar3;
  int in_ECX;
  Vector3<float> *in_RDX;
  Vector3<float> *in_RSI;
  int iVar4;
  float in_XMM0_Da;
  Float t;
  Float b;
  double dVar5;
  undefined1 auVar7 [64];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Point3<float> PVar13;
  int i_1;
  Float nPartial;
  int i;
  Float o;
  Float lambda;
  Float sum;
  int nInt;
  Float n;
  Float len2;
  Float in_stack_ffffffffffffff68;
  Float in_stack_ffffffffffffff6c;
  Float in_stack_ffffffffffffff70;
  int local_84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_70 [4];
  float s;
  undefined8 local_50;
  float local_48;
  int local_44;
  float local_40;
  float local_3c;
  Float local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  int local_20;
  float local_1c;
  Vector3<float> *local_18;
  undefined1 auVar6 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_20 = in_ECX;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_28 = LengthSquared<float>(in_RSI);
  local_2c = LengthSquared<float>(local_18);
  pfVar3 = std::max<float>(&local_28,&local_2c);
  local_24 = *pfVar3;
  auVar7._0_4_ = Log2(0.0);
  auVar7._4_60_ = extraout_var;
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),auVar7._0_16_,
                           SUB6416(ZEXT464(0xbf800000),0));
  local_30 = Clamp<float,int,int>(auVar6._0_4_,0,local_20);
  dVar5 = std::floor((double)(ulong)(uint)local_30);
  local_34 = (int)SUB84(dVar5,0);
  local_38 = 0.0;
  local_3c = 1.0;
  local_40 = 1.0;
  for (local_44 = 0; fVar1 = local_40, uVar2 = _local_70, s = (float)((ulong)_local_70 >> 0x20),
      local_44 < local_34; local_44 = local_44 + 1) {
    auVar12 = (undefined1  [56])0x0;
    PVar13 = operator*(s,(Tuple3<pbrt::Point3,_float> *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    _local_70 = uVar2;
    local_48 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar12;
    local_50 = vmovlpd_avx(auVar8._0_16_);
    iVar4 = (int)&local_50;
    auVar9._0_4_ = Noise((Point3f *)0x707e83);
    auVar9._4_60_ = extraout_var_00;
    auVar6 = auVar9._0_16_;
    std::abs(iVar4);
    auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)fVar1),ZEXT416((uint)local_38));
    local_38 = auVar6._0_4_;
    local_3c = local_3c * 1.99;
    local_40 = local_1c * local_40;
  }
  t = SmoothStep(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  auVar12 = (undefined1  [56])0x0;
  PVar13 = operator*(s,(Tuple3<pbrt::Point3,_float> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  auVar10._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  _local_70 = vmovlpd_avx(auVar10._0_16_);
  iVar4 = (int)local_70;
  b = Noise((Point3f *)0x707f53);
  std::abs(iVar4);
  auVar11._0_4_ = Lerp(t,0.2,b);
  auVar11._4_60_ = extraout_var_01;
  auVar6 = vfmadd213ss_fma(auVar11._0_16_,ZEXT416((uint)fVar1),ZEXT416((uint)local_38));
  local_38 = auVar6._0_4_;
  for (local_84 = local_34; local_84 < local_20; local_84 = local_84 + 1) {
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e4ccccd),0),ZEXT416((uint)local_40),
                             ZEXT416((uint)local_38));
    local_38 = auVar6._0_4_;
    local_40 = local_1c * local_40;
  }
  return local_38;
}

Assistant:

Float Turbulence(const Point3f &p, const Vector3f &dpdx, const Vector3f &dpdy,
                 Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for turbulence
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * std::abs(Noise(lambda * p));
        lambda *= 1.99f;
        o *= omega;
    }

    // Account for contributions of clamped octaves in turbulence
    Float nPartial = n - nInt;
    sum += o * Lerp(SmoothStep(nPartial, .3f, .7f), 0.2, std::abs(Noise(lambda * p)));
    for (int i = nInt; i < maxOctaves; ++i) {
        sum += o * 0.2f;
        o *= omega;
    }

    return sum;
}